

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O1

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  double dVar3;
  ON_ParseSettings parse_settings_00;
  ON_ParseSettings parse_settings_01;
  ON_ParseSettings parse_settings_02;
  ON_ParseSettings parse_settings_03;
  ON__UINT32 aOVar4 [2];
  ON__UINT32 aOVar5 [2];
  undefined8 uVar6;
  ON__UINT16 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT64 OVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  ON_ParseSettings *pOVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  double *pdVar25;
  AngleUnitSystem *pAVar26;
  undefined4 uVar27;
  double dVar28;
  AngleUnitSystem next_us;
  double x;
  ON_ParseSettings input_parse_settings;
  ON_ParseSettings pr;
  double next_value;
  ON_ParseSettings pr1;
  ON_ParseSettings next_pr;
  AngleUnitSystem local_121;
  int local_120;
  AngleUnitSystem local_119;
  double local_118;
  AngleUnitSystem *local_110;
  double local_108;
  undefined8 uStack_100;
  double *local_f0;
  ON_ParseSettings *local_e8;
  wchar_t *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  ON_ParseSettings local_c8;
  ON_ParseSettings local_a8;
  double local_80;
  ON_ParseSettings local_78;
  ON_ParseSettings local_58;
  
  OVar10 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar6 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar5 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar4 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_118 = -1.23432101234321e+308;
  local_121 = None;
  local_c8.m_reserved_bits = parse_settings.m_reserved_bits;
  local_c8.m_context_locale_id = parse_settings.m_context_locale_id;
  local_c8.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  local_c8.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  local_c8.m_reserved = parse_settings.m_reserved;
  local_c8.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  local_c8.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  local_c8.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  local_c8.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  local_a8._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  local_a8.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  local_a8.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_a8.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (angle_value != (double *)0x0) {
    *angle_value = -1.23432101234321e+308;
  }
  if (str_angle_unit_system != (AngleUnitSystem *)0x0) {
    *str_angle_unit_system = None;
  }
  uVar11 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar6;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar6,4);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar6,6);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar6,7);
    OVar9 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar11;
    parse_results->m_context_locale_id = OVar7;
    parse_results->m_context_angle_unit_system = OVar8;
    parse_results->m_context_length_unit_system = OVar9;
    parse_results->m_reserved = OVar10;
    *&parse_results->m_true_default_bits = aOVar4;
    *&parse_results->m_false_default_bits = aOVar5;
  }
  local_f0 = angle_value;
  local_e8 = parse_results;
  bVar12 = ON_ParseSettings::ParseSurveyorsNotation(&local_c8);
  local_e0 = str;
  local_110 = str_angle_unit_system;
  if (bVar12) {
    local_120 = 0;
    uVar23 = 0;
    local_108 = (double)CONCAT44(local_108._4_4_,str_count);
    if (0 < str_count || str_count == -1) {
      bVar12 = ON_ParseSettings::ParseLeadingWhiteSpace(&local_c8);
      uVar23 = 0;
      if (bVar12) {
        bVar12 = ON_ParseSettings::IsLeadingWhiteSpace(&local_c8,*str);
        uVar23 = 0;
        if (bVar12) {
          ON_ParseSettings::SetParseLeadingWhiteSpace(&local_a8,true);
          uVar23 = 0;
          if (0 < str_count) {
            uVar24 = 0;
            do {
              bVar12 = ON_ParseSettings::IsLeadingWhiteSpace(&local_c8,str[uVar24]);
              uVar23 = uVar24;
              if (!bVar12) break;
              uVar24 = uVar24 + 1;
              uVar23 = (ulong)(uint)str_count;
            } while ((uint)str_count != uVar24);
            str_count = local_108._0_4_;
          }
        }
      }
    }
    uVar22 = (uint)uVar23;
    ON_ParseSettings::SetParseLeadingWhiteSpace(&local_c8,false);
    bVar12 = true;
    if ((str_count == -1) || ((int)(uVar22 + 3) <= str_count)) {
      wVar2 = str[uVar23 & 0xffffffff];
      if (wVar2 < L'n') {
        if (wVar2 == L'N') {
LAB_0056bcc5:
          local_120 = 0x4e;
LAB_0056bcdd:
          uVar22 = uVar22 + 1;
          bVar12 = false;
        }
        else if (wVar2 == L'S') goto LAB_0056bcd2;
      }
      else {
        if (wVar2 == L's') {
LAB_0056bcd2:
          local_120 = 0x53;
          goto LAB_0056bcdd;
        }
        if (wVar2 == L'n') goto LAB_0056bcc5;
      }
    }
    if (!bVar12) {
      ON_ParseSettings::SetParseIntegerDashFraction(&local_c8,false);
    }
    uVar15 = 0;
    uVar16 = 0;
    if (0 < str_count) {
      uVar16 = uVar22;
    }
    local_78.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    local_78.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    local_78.m_context_angle_unit_system =
         ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    local_78.m_context_length_unit_system =
         ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    local_78.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    local_78.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    local_78.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    local_78.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    local_78.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
    pwVar1 = local_e0 + (int)uVar22;
    parse_settings_01.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
    parse_settings_01.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
    parse_settings_01.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
    parse_settings_01.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
    parse_settings_01.m_reserved_bits = local_c8.m_reserved_bits;
    parse_settings_01.m_context_locale_id = local_c8.m_context_locale_id;
    parse_settings_01.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
    parse_settings_01.m_context_length_unit_system = local_c8.m_context_length_unit_system;
    parse_settings_01.m_reserved = local_c8.m_reserved;
    uVar14 = ON_ParseNumberExpression
                       (pwVar1,str_count - uVar16,parse_settings_01,&local_78,&local_118);
    if ((int)uVar14 < 1) {
      bVar13 = ON_ParseSettings::ParseScientificENotation(&local_c8);
      bVar12 = false;
      if (!bVar13) goto LAB_0056be2f;
      bVar13 = false;
      ON_ParseSettings::SetParseScientificENotation(&local_c8,false);
      parse_settings_02.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
      parse_settings_02.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
      parse_settings_02.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
      parse_settings_02.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
      parse_settings_02.m_reserved_bits = local_c8.m_reserved_bits;
      parse_settings_02.m_context_locale_id = local_c8.m_context_locale_id;
      parse_settings_02.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
      parse_settings_02.m_context_length_unit_system = local_c8.m_context_length_unit_system;
      parse_settings_02.m_reserved = local_c8.m_reserved;
      uVar15 = ON_ParseNumberExpression
                         (pwVar1,str_count - uVar16,parse_settings_02,&local_a8,&local_118);
      if ((int)uVar15 < 1) {
        bVar12 = false;
      }
      else {
        bVar12 = false;
        if ((local_e0[uVar15] | 0x20U) == 0x65) goto LAB_0056be2f;
        bVar13 = false;
      }
    }
    else {
      if ((bool)(bVar12 & local_118 <= 0.0)) {
        bVar12 = Internal_IsNegativeInteger(&local_c8,pwVar1,uVar14 - uVar22);
      }
      else {
        bVar12 = false;
      }
      ON_ParseSettings::operator|=(&local_a8,&local_78);
      uVar15 = uVar14;
LAB_0056be2f:
      uVar22 = uVar22 + uVar15;
      bVar13 = true;
    }
    str_count = local_108._0_4_;
    if (!bVar13) {
      return 0;
    }
  }
  else {
    parse_settings_00.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = local_c8.m_reserved_bits;
    parse_settings_00.m_context_locale_id = local_c8.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = local_c8.m_context_length_unit_system;
    parse_settings_00.m_reserved = local_c8.m_reserved;
    uVar22 = ON_ParseNumberExpression(str,str_count,parse_settings_00,&local_a8,&local_118);
    if ((int)uVar22 < 1) {
      return 0;
    }
    if (local_118 <= 0.0) {
      local_120 = 0;
      bVar12 = Internal_IsNegativeInteger(&local_c8,str,uVar22);
    }
    else {
      local_120 = 0;
      bVar12 = false;
    }
  }
  iVar18 = str_count;
  if ((0 < str_count) && (iVar18 = str_count - uVar22, str_count < (int)uVar22)) {
    return 0;
  }
  pwVar1 = local_e0 + (int)uVar22;
  uVar16 = ON_ParseSettings::PreferedLocaleId(&parse_settings);
  iVar17 = ON_ParseAngleUnitName(pwVar1,iVar18,uVar16,&local_121);
  pOVar21 = local_e8;
  pdVar25 = local_f0;
  pAVar26 = local_110;
  bVar13 = false;
  if (local_121 == Degrees) {
    bVar13 = bVar12;
  }
  if (bVar12 == false) {
    bVar13 = bVar12;
  }
  if (iVar17 < 1) {
    local_121 = ON_ParseSettings::DefaultAngleUnitSystem(&parse_settings);
    dVar20 = (double)(ulong)uVar22;
    pOVar21 = local_e8;
    pdVar25 = local_f0;
    pAVar26 = local_110;
  }
  else {
    if ((0 < iVar18) && (bVar12 = iVar18 < iVar17, iVar18 = iVar18 - iVar17, bVar12)) {
      return 0;
    }
    dVar20 = (double)(ulong)(iVar17 + uVar22);
    if (iVar18 == -1) {
      if (local_121 == Degrees) goto LAB_0056bf0d;
      iVar18 = -1;
    }
    else if ((int)(iVar17 + uVar22 + 1) < iVar18 && local_121 == Degrees) {
LAB_0056bf0d:
      local_d8 = SUB84(local_118,0);
      uStack_d4 = (undefined4)((ulong)local_118 >> 0x20);
      local_108 = dVar20;
      dVar28 = floor(local_118);
      dVar20 = local_108;
      if (((((((dVar28 == (double)CONCAT44(uStack_d4,local_d8)) &&
              (!NAN(dVar28) && !NAN((double)CONCAT44(uStack_d4,local_d8)))) &&
             (bVar12 = ON_ParseSettings::ParseArcDegreesMinutesSeconds(&local_c8),
             dVar20 = local_108, bVar12)) &&
            ((bVar12 = ON_ParseSettings::ParseSignificandDecimalPoint(&local_a8), dVar20 = local_108
             , !bVar12 &&
             (bVar12 = ON_ParseSettings::ParseScientificENotation(&local_a8), dVar20 = local_108,
             !bVar12)))) &&
           ((bVar12 = ON_ParseSettings::ParseRationalNumber(&local_a8), dVar20 = local_108, !bVar12
            && ((bVar12 = ON_ParseSettings::ParsePi(&local_a8), dVar20 = local_108, !bVar12 &&
                (bVar12 = ON_ParseSettings::ParseDivision(&local_a8), dVar20 = local_108, !bVar12)))
            ))) && (bVar12 = ON_ParseSettings::ParseMultiplication(&local_a8), dVar20 = local_108,
                   !bVar12)) &&
         (bVar12 = ON_ParseSettings::ParseIntegerDashFraction(&local_a8), dVar20 = local_108,
         !bVar12)) {
        local_78.m_reserved_bits = local_c8.m_reserved_bits;
        local_78.m_context_locale_id = local_c8.m_context_locale_id;
        local_78.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
        local_78.m_context_length_unit_system = local_c8.m_context_length_unit_system;
        local_78.m_reserved = local_c8.m_reserved;
        local_78.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
        local_78.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
        local_78.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
        local_78.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
        local_110 = pAVar26;
        DisableStartAndExpressionParsingStuff(&local_78);
        iVar17 = 0;
        ON_ParseSettings::SetParseSignificandDigitSeparators(&local_78,false);
        ON_ParseSettings::SetParseIntegerDashFraction(&local_78,false);
        ON_ParseSettings::SetParseRationalNumber(&local_78,false);
        ON_ParseSettings::SetParsePi(&local_78,false);
        ON_ParseSettings::SetParseSurveyorsNotation(&local_78,false);
        ON_ParseSettings::SetParseUnaryMinus(&local_78,false);
        ON_ParseSettings::SetParseUnaryPlus(&local_78,false);
        uStack_100 = 0;
        local_d8 = 0;
        uStack_d4 = 0;
        uStack_d0 = 0;
        dVar20 = local_108;
        local_108 = 0.0;
        do {
          uVar22 = SUB84(dVar20,0);
          iVar19 = ~uVar22 + iVar18;
          local_80 = -1.23432101234321e+308;
          local_119 = None;
          local_58.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
          local_58.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
          local_58.m_context_angle_unit_system =
               ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
          local_58.m_context_length_unit_system =
               ON_ParseSettings::FalseSettings.m_context_length_unit_system;
          local_58.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
          local_58.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          local_58.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          local_58.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0]
          ;
          local_58.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1]
          ;
          if (iVar18 == -1) {
            iVar19 = -1;
          }
          parse_settings_03.m_false_default_bits[0] = local_78.m_false_default_bits[0];
          parse_settings_03.m_false_default_bits[1] = local_78.m_false_default_bits[1];
          parse_settings_03.m_true_default_bits[0] = local_78.m_true_default_bits[0];
          parse_settings_03.m_true_default_bits[1] = local_78.m_true_default_bits[1];
          parse_settings_03.m_reserved_bits = local_78.m_reserved_bits;
          parse_settings_03.m_context_locale_id = local_78.m_context_locale_id;
          parse_settings_03.m_context_angle_unit_system = local_78.m_context_angle_unit_system;
          parse_settings_03.m_context_length_unit_system = local_78.m_context_length_unit_system;
          parse_settings_03.m_reserved = local_78.m_reserved;
          iVar19 = ON_ParseAngleExpression
                             (local_e0 + (int)uVar22,iVar19,parse_settings_03,&local_80,&local_58,
                              &local_119);
          if (iVar19 < 1) {
            bVar12 = false;
            iVar19 = iVar17;
          }
          else if ((local_80 < 0.0) || (60.0 <= local_80)) {
LAB_0056c317:
            bVar12 = false;
            bVar13 = false;
            iVar19 = iVar17;
          }
          else {
            if (iVar17 == 0) {
              iVar17 = 0;
              if (local_119 != Minutes) {
                if (local_119 != Seconds) goto LAB_0056c317;
                iVar17 = 1;
              }
            }
            else {
              iVar17 = 1;
              if (local_119 != Seconds) goto LAB_0056c317;
            }
            if (local_119 == Seconds) {
              local_108 = local_80;
              uStack_100 = 0;
            }
            else if (local_119 == Minutes) {
              local_d8 = SUB84(local_80,0);
              uStack_d4 = (undefined4)((ulong)local_80 >> 0x20);
              uStack_d0 = 0;
            }
            else {
              bVar13 = false;
            }
            dVar20 = (double)(ulong)(uVar22 + iVar19);
            ON_ParseSettings::SetParseArcDegreesMinutesSeconds(&local_a8,true);
            ON_ParseSettings::operator|=(&local_a8,&local_58);
            bVar12 = true;
            iVar19 = iVar17;
          }
        } while ((bVar12) && (iVar17 = iVar19 + 1, iVar19 < 1));
        uVar27 = uStack_d4;
        dVar28 = local_108;
        if ((bVar13 != false) &&
           (((local_118 <= 0.0 && (0.0 <= (double)CONCAT44(uStack_d4,local_d8))) &&
            (0.0 <= local_108)))) {
          dVar3 = -(double)CONCAT44(uStack_d4,local_d8);
          uVar27 = (int)((ulong)dVar3 >> 0x20);
          if ((double)CONCAT44(uStack_d4,local_d8) <= dVar3) {
            uVar27 = uStack_d4;
          }
          if (0.0 < local_108) {
            dVar28 = -local_108;
          }
        }
        pAVar26 = local_110;
        pdVar25 = local_f0;
        pOVar21 = local_e8;
        if ((dVar28 != 0.0) || (NAN(dVar28))) {
          local_118 = (local_118 * 60.0 + (double)CONCAT44(uVar27,local_d8)) * 60.0 + dVar28;
          local_121 = Seconds;
        }
        else if (((double)CONCAT44(uVar27,local_d8) != 0.0) ||
                (NAN((double)CONCAT44(uVar27,local_d8)))) {
          local_118 = local_118 * 60.0 + (double)CONCAT44(uVar27,local_d8);
          local_121 = Minutes;
        }
      }
    }
  }
  iVar17 = SUB84(dVar20,0);
  if ((local_120 == 0) || (iVar17 < 1)) goto LAB_0056c0e7;
  if ((0 < iVar18) && (iVar18 <= iVar17)) {
    return 0;
  }
  wVar2 = local_e0[(ulong)dVar20 & 0xffffffff];
  iVar18 = 0;
  bVar12 = true;
  if (wVar2 < L'e') {
    if (wVar2 == L'E') {
LAB_0056c022:
      iVar18 = 0x45;
      goto LAB_0056c046;
    }
    if (wVar2 == L'W') goto LAB_0056c03e;
  }
  else {
    if (wVar2 != L'w') {
      iVar18 = 0;
      if (wVar2 != L'e') goto LAB_0056c048;
      goto LAB_0056c022;
    }
LAB_0056c03e:
    iVar18 = 0x57;
LAB_0056c046:
    iVar17 = iVar17 + 1;
    bVar12 = false;
  }
LAB_0056c048:
  if (bVar12) {
    return 0;
  }
  if (local_121 == None) {
    local_121 = Degrees;
  }
  dVar20 = ON::AngleUnitScale(Turns,local_121);
  dVar20 = dVar20 * 0.25;
  if (local_120 == 0x53) {
    if (iVar18 == 0x57) {
      dVar20 = dVar20 + local_118;
    }
    else {
      if (iVar18 != 0x45) {
        return 0;
      }
      dVar20 = dVar20 - local_118;
    }
    local_118 = -dVar20;
  }
  else {
    if (local_120 != 0x4e) {
      return 0;
    }
    if (iVar18 == 0x57) {
      local_118 = dVar20 + local_118;
    }
    else {
      if (iVar18 != 0x45) {
        return 0;
      }
      local_118 = dVar20 - local_118;
    }
  }
LAB_0056c0e7:
  if (pdVar25 != (double *)0x0) {
    *pdVar25 = local_118;
  }
  if (pOVar21 != (ON_ParseSettings *)0x0) {
    pOVar21->m_reserved_bits = local_a8.m_reserved_bits;
    pOVar21->m_context_locale_id = local_a8.m_context_locale_id;
    pOVar21->m_context_angle_unit_system = local_a8.m_context_angle_unit_system;
    pOVar21->m_context_length_unit_system = local_a8.m_context_length_unit_system;
    pOVar21->m_reserved = local_a8.m_reserved;
    *&pOVar21->m_true_default_bits = local_a8.m_true_default_bits;
    *&pOVar21->m_false_default_bits = local_a8.m_false_default_bits;
  }
  if (pAVar26 != (AngleUnitSystem *)0x0) {
    *pAVar26 = local_121;
    return iVar17;
  }
  return iVar17;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::AngleUnitSystem angle_us = ON::AngleUnitSystem::None;
  ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != angle_value )
    *angle_value = ON_UNSET_VALUE;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  bool bNegativeDegreesMinutesSecondsIsPossible = false;
  int str_index = 0;
  ON__UINT32 cSurveyorsNotationNS = 0;
  ON__UINT32 cSurveyorsNotationEW = 0;
  if ( input_parse_settings.ParseSurveyorsNotation() )
  {
    if (    (str_index < str_count || -1 == str_count)
         && input_parse_settings.ParseLeadingWhiteSpace() 
         && input_parse_settings.IsLeadingWhiteSpace(str[str_index])
       )
    {
      // skip over leading white space
      pr.SetParseLeadingWhiteSpace(true);
      while ( str_index < str_count && input_parse_settings.IsLeadingWhiteSpace(str[str_index]) )
      {
        str_index++;
      }
    }

    input_parse_settings.SetParseLeadingWhiteSpace(false);

    if ( ((str_index+3 <= str_count) || -1 == str_count) )
    {
      // Do not localize "N" or "n" or "S" or "s".  
      // These letters are specified by Surveyor's notation specification.
      // [TODO - Reference needed].
      switch(str[str_index])
      {
      case 'N': // Do not localize this letter
      case 'n': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'N';
        break;
      case 'S': // Do not localize this letter
      case 's': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'S';
        break;
      }
    }

    if ( 0 != cSurveyorsNotationNS )
    {
      input_parse_settings.SetParseIntegerDashFraction(false);
    }

    const int str_number_count = (str_count > 0 ? str_count-str_index : str_count);
    ON_ParseSettings pr1(ON_ParseSettings::FalseSettings);
    int str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr1,&x);
    if ( str_number_index > 0 )
    {
      if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str + str_index, str_number_index - str_index))
        bNegativeDegreesMinutesSecondsIsPossible = true;
      pr |= pr1;
    }
    else
    {
      if ( input_parse_settings.ParseScientificENotation() )
      {
        // It may be that the string looked like N15.23E and the number parser failed
        // because 15.23E is an invalid attempt at using scientific E notation.
        input_parse_settings.SetParseScientificENotation(false);
        str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr,&x);
        if ( str_number_index <= 0 )
          return 0;
        if ( 'E' != str[str_number_index] && 'e' != str[str_number_index] )
          return 0;
      }
    }
    str_index += str_number_index;
  }
  else
  {
    str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
    if ( str_index <= 0 )
      return 0;
    if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str, str_index))
      bNegativeDegreesMinutesSecondsIsPossible = true;
  }

  if ( str_count > 0 )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  int end_of_unit_index = ON_ParseAngleUnitName(str+str_index,str_count,parse_settings.PreferedLocaleId(),&angle_us);

  if (bNegativeDegreesMinutesSecondsIsPossible && ON::AngleUnitSystem::Degrees != angle_us)
    bNegativeDegreesMinutesSecondsIsPossible = false;

  if ( end_of_unit_index > 0 )
  {
    if ( str_count > 0 )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    if ( -1 == str_count || str_index+1 < str_count )
    {
      if ( ON::AngleUnitSystem::Degrees == angle_us 
           && floor(x) == x
           && input_parse_settings.ParseArcDegreesMinutesSeconds() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParsePi()
           && false == pr.ParseDivision()
           && false == pr.ParseMultiplication()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse arc minutes
        ON_ParseSettings next_parse_settings = input_parse_settings;
        DisableStartAndExpressionParsingStuff(next_parse_settings);
        next_parse_settings.SetParseSignificandDigitSeparators(false);
        next_parse_settings.SetParseIntegerDashFraction(false);
        next_parse_settings.SetParseRationalNumber(false);
        next_parse_settings.SetParsePi(false);
        next_parse_settings.SetParseSurveyorsNotation(false);
        next_parse_settings.SetParseUnaryMinus(false);
        next_parse_settings.SetParseUnaryPlus(false);

        double arc_minutes_value = 0.0;
        double arc_seconds_value = 0.0;

        for ( int next_value_pass = 0; next_value_pass < 2; next_value_pass++ )
        {
          double next_value = ON_UNSET_VALUE;
          ON::AngleUnitSystem next_us(ON::AngleUnitSystem::None);
          ON_ParseSettings next_pr(ON_ParseSettings::FalseSettings);
          int next_str_index = ON_ParseAngleExpression(
            str+str_index,
            ((-1 == str_count) ? str_count : (str_count-str_index-1)),
            next_parse_settings,&next_value,&next_pr,&next_us);

          if ( next_str_index <= 0 )
            break;

          if (!(next_value >= 0.0 && next_value < 60.0))
          {
            bNegativeDegreesMinutesSecondsIsPossible = false;
            break;
          }

          if ( 0 == next_value_pass )
          {
            if ( ON::AngleUnitSystem::Minutes != next_us )
            {
              if ( ON::AngleUnitSystem::Seconds == next_us && 0 == next_value_pass )
                next_value_pass = 1;
              else
              {
                bNegativeDegreesMinutesSecondsIsPossible = false;
                break;
              }
            }
          }
          else if ( 1 == next_value_pass )
          {
            if (ON::AngleUnitSystem::Seconds != next_us)
            {
              bNegativeDegreesMinutesSecondsIsPossible = false;              
              break;
            }
          }

          if (ON::AngleUnitSystem::Minutes == next_us)
            arc_minutes_value = next_value;
          else if (ON::AngleUnitSystem::Seconds == next_us)
            arc_seconds_value = next_value;
          else
            bNegativeDegreesMinutesSecondsIsPossible = false;

          str_index += next_str_index;
          pr.SetParseArcDegreesMinutesSeconds(true);
          pr |= next_pr;
        }

        if (
          bNegativeDegreesMinutesSecondsIsPossible
          && x <= 0.0 
          && arc_minutes_value >= 0.0 
          && arc_seconds_value >= 0.0
          )
        {
          // parsing something like -90d40'30"
          if (arc_minutes_value > 0.0)
            arc_minutes_value = -arc_minutes_value;
          if (arc_seconds_value > 0.0)
            arc_seconds_value = -arc_seconds_value;
        }

        if ( 0 != arc_seconds_value )
        {
          x = 60.0*(60.0*x + arc_minutes_value) + arc_seconds_value;
          angle_us = ON::AngleUnitSystem::Seconds;
        }
        else if ( 0 != arc_minutes_value )
        {
          x = 60.0*x + arc_minutes_value;
          angle_us = ON::AngleUnitSystem::Minutes;
        }
      }
    }
  }
  else
  {
    bNegativeDegreesMinutesSecondsIsPossible = false;
    angle_us = parse_settings.DefaultAngleUnitSystem();
  }

  if ( str_index > 0 && 0 != cSurveyorsNotationNS )
  {
    if ( str_count > 0 )
    {
      if (str_index+1 > str_count )
        return 0;
    }

    // Do not localize "E" or "e" or "W" or "w".  
    // These letters are specified by Surveyor's notation specification.
    // [TODO - Reference needed].
    switch(str[str_index])
    {
    case 'E': // Do not localize this letter
    case 'e': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'E';
      break;
    case 'W': // Do not localize this letter
    case 'w': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'W';
      break;
    default:
      cSurveyorsNotationEW = 0;
      break;
    }

    if (0 == cSurveyorsNotationEW )
      return 0;

    if ( ON::AngleUnitSystem::None == angle_us )
    {
      // Surveyor's notation implies degrees when no angle unit
      // is explicitly supplied.  This is done because it is
      // difficult for many users to enter a degree symbol
      // when typing input and Surveyor's notation is almost
      // always in degrees. [TODO cite reference].
      angle_us = ON::AngleUnitSystem::Degrees;
    }

    // The value of right_angle is calculated this way because it will
    // yield the most precise result in all angle unit systems since
    // IEEE double multiplication by 0.25 is exact and the value
    // returned by ON::AngleUnitScale(ON::turns,angle_us) is exact 
    // for all supported angle units except radians where pi rounded
    // because the IEEE double must approximate the value of pi.
    const double right_angle = 0.25*ON::AngleUnitScale(ON::AngleUnitSystem::Turns,angle_us);

    switch(cSurveyorsNotationNS)
    {
    case 'N':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // N<angle>E
        x = right_angle - x;
        break;
      case 'W': // N<angle>W
        x = right_angle + x;
        break;
      default:
        return 0;
      }
      break;
    case 'S':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // S<angle>E
        x =  -(right_angle - x);
        break;
      case 'W': // S<angle>W
        x =  -(right_angle + x);
        break;
      default:
        return 0;
      }
      break;
    default:
      return 0;
    }
  }

  if ( angle_value )
    *angle_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;

  return str_index;
}